

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

string * __thiscall
higan::Buffer::ReadAllAsString_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_1a;
  undefined1 local_19;
  Buffer *local_18;
  Buffer *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Buffer *)__return_storage_ptr__;
  pcVar1 = ReadBegin(this);
  sVar2 = ReadableSize(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  sVar2 = ReadableSize(this);
  AddReadIndex(this,sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::ReadAllAsString()
{
	std::string result(ReadBegin(), ReadableSize());
	AddReadIndex(ReadableSize());
	return result;
}